

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

msocket_t * msocket_accept(msocket_t *self,msocket_t *child)

{
  uint8_t uVar1;
  undefined4 local_2c;
  socklen_t sockoptlen;
  int sockoptval;
  int result;
  uint8_t placementNew;
  msocket_t *child_local;
  msocket_t *self_local;
  
  if ((self == (msocket_t *)0x0) || (self->state != '\x01')) {
    self_local = (msocket_t *)0x0;
  }
  else {
    sockoptval._3_1_ = '\0';
    sockoptlen = 0;
    _result = child;
    child_local = self;
    if (child == (msocket_t *)0x0) {
      _result = msocket_new(self->addressFamily);
    }
    else {
      sockoptval._3_1_ = '\x01';
      msocket_create(child,self->addressFamily);
    }
    pthread_mutex_lock((pthread_mutex_t *)&child_local->mutex);
    child_local->state = '\x02';
    pthread_mutex_unlock((pthread_mutex_t *)&child_local->mutex);
    uVar1 = child_local->addressFamily;
    if (uVar1 == '\x01') {
      sockoptlen = msocket_accept_local(child_local,_result);
    }
    else if (uVar1 == '\x02') {
      sockoptlen = msocket_accept_inet(child_local,_result);
    }
    else if (uVar1 == '\n') {
      sockoptlen = msocket_accept_inet6(child_local,_result);
    }
    else {
      sockoptlen = 0xffffffff;
    }
    pthread_mutex_lock((pthread_mutex_t *)&child_local->mutex);
    child_local->state = '\x01';
    pthread_mutex_unlock((pthread_mutex_t *)&child_local->mutex);
    if ((int)sockoptlen < 0) {
      if (sockoptval._3_1_ == '\0') {
        msocket_delete(_result);
      }
      else {
        msocket_destroy(_result);
      }
      self_local = (msocket_t *)0x0;
    }
    else {
      if ((_result->addressFamily == '\x02') || (_result->addressFamily == '\n')) {
        local_2c = 1;
        setsockopt(_result->tcpsockfd,6,1,&local_2c,4);
      }
      pthread_mutex_lock((pthread_mutex_t *)&_result->mutex);
      _result->state = '\x04';
      _result->socketMode = '\x02';
      _result->newConnection = '\x01';
      pthread_mutex_unlock((pthread_mutex_t *)&_result->mutex);
      self_local = _result;
    }
  }
  return self_local;
}

Assistant:

msocket_t *msocket_accept(msocket_t *self, msocket_t *child){
   if ( (self != 0) && (self->state == MSOCKET_STATE_LISTENING) ) {

      uint8_t placementNew = 0u;
      int result = 0u;

      if(child == 0) {
         child = msocket_new(self->addressFamily);
      }
      else {
         placementNew = 1;
         msocket_create(child,self->addressFamily);
      }
      MUTEX_LOCK(self->mutex);
      self->state = MSOCKET_STATE_ACCEPTING;
      MUTEX_UNLOCK(self->mutex);

      switch (self->addressFamily) {
      case AF_INET:
         result = msocket_accept_inet(self, child);
         break;
      case AF_INET6:
         result = msocket_accept_inet6(self, child);
         break;
#ifndef _WIN32
      case AF_LOCAL:
         result = msocket_accept_local(self, child);
         break;
      default:
         result = -1;
#endif
      }

      MUTEX_LOCK(self->mutex);
      self->state = MSOCKET_STATE_LISTENING;
      MUTEX_UNLOCK(self->mutex);

      if (result < 0) {
         if (placementNew == 0) {
            msocket_delete(child);
         }
         else {
            msocket_destroy(child);
         }
         return (msocket_t*)0;
      }

      if ( (child->addressFamily == AF_INET) || (child->addressFamily == AF_INET6) ) {
         int sockoptval = 1;
         socklen_t sockoptlen = sizeof(sockoptval);
         setsockopt(child->tcpsockfd, IPPROTO_TCP, TCP_NODELAY, (const char*)&sockoptval, sockoptlen);
      }

      MUTEX_LOCK(child->mutex);
      child->state = MSOCKET_STATE_ESTABLISHED;
      child->socketMode = MSOCKET_MODE_TCP;
      child->newConnection = 1;
      MUTEX_UNLOCK(child->mutex);
      return child;
   }
   return (msocket_t *) 0;
}